

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * Extra_bddMove(DdManager *dd,DdNode *bF,int nVars)

{
  DdNode *pDVar1;
  DdNode *bDist;
  
  pDVar1 = bF;
  if ((nVars != 0) && (*(int *)((ulong)bF & 0xfffffffffffffffe) != 0x7fffffff)) {
    if (dd->size < nVars) {
      __assert_fail("nVars <= dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddMisc.c"
                    ,0xc6,"DdNode *Extra_bddMove(DdManager *, DdNode *, int)");
    }
    if (nVars < 1) {
      bDist = (DdNode *)((ulong)dd->vars[(uint)-nVars] ^ 1);
    }
    else {
      bDist = dd->vars[(uint)nVars];
    }
    do {
      dd->reordered = 0;
      pDVar1 = extraBddMove(dd,bF,bDist);
    } while (dd->reordered == 1);
  }
  return pDVar1;
}

Assistant:

DdNode * Extra_bddMove( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int nVars) 
{
    DdNode * res;
    DdNode * bVars;
    if ( nVars == 0 )
        return bF;
    if ( Cudd_IsConstant(bF) )
        return bF;
    assert( nVars <= dd->size );
    if ( nVars > 0 )
        bVars = dd->vars[nVars];
    else
        bVars = Cudd_Not(dd->vars[-nVars]);

    do {
        dd->reordered = 0;
        res = extraBddMove( dd, bF, bVars );
    } while (dd->reordered == 1);
    return(res);

}